

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeccakP-1600-reference.c
# Opt level: O0

void KeccakP1600_DisplayRoundConstants(FILE *f)

{
  FILE *in_RDI;
  uint i;
  uint local_c;
  
  for (local_c = 0; local_c < 0x18; local_c = local_c + 1) {
    fprintf(in_RDI,"RC[%02i][0][0] = ",(ulong)local_c);
    fprintf(in_RDI,"%08X",KeccakRoundConstants[local_c] >> 0x20);
    fprintf(in_RDI,"%08X",KeccakRoundConstants[local_c] & 0xffffffff);
    fprintf(in_RDI,"\n");
  }
  fprintf(in_RDI,"\n");
  return;
}

Assistant:

void KeccakP1600_DisplayRoundConstants(FILE *f)
{
    unsigned int i;

    for(i=0; i<maxNrRounds; i++) {
        fprintf(f, "RC[%02i][0][0] = ", i);
        fprintf(f, "%08X", (unsigned int)(KeccakRoundConstants[i] >> 32));
        fprintf(f, "%08X", (unsigned int)(KeccakRoundConstants[i] & 0xFFFFFFFFULL));
        fprintf(f, "\n");
    }
    fprintf(f, "\n");
}